

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget_p.h
# Opt level: O1

void __thiscall QWidgetPrivate::setTextureChildSeen(QWidgetPrivate *this)

{
  long lVar1;
  
  while( true ) {
    if ((*(uint *)(this + 0x250) >> 0x19 & 1) != 0) {
      return;
    }
    *(uint *)(this + 0x250) = *(uint *)(this + 0x250) | 0x2000000;
    if ((*(byte *)(*(long *)(*(long *)(this + 8) + 0x20) + 0xc) & 1) != 0) break;
    lVar1 = *(long *)(*(long *)(*(long *)(this + 8) + 8) + 0x10);
    if (lVar1 == 0) {
      return;
    }
    this = *(QWidgetPrivate **)(lVar1 + 8);
  }
  return;
}

Assistant:

void setTextureChildSeen()
    {
        Q_Q(QWidget);
        if (textureChildSeen)
            return;
        textureChildSeen = 1;

        if (!q->isWindow()) {
            QWidget *parent = q->parentWidget();
            if (parent)
                get(parent)->setTextureChildSeen();
        }
    }